

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O1

void __thiscall
Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this,VariableSizeAllocationsManager *rhs)

{
  IMemoryAllocator *pIVar1;
  Char *pCVar2;
  Int32 IVar3;
  undefined4 uVar4;
  
  pIVar1 = (rhs->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_Allocator;
  pCVar2 = (rhs->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpDescription;
  IVar3 = (rhs->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpLineNumber;
  uVar4 = *(undefined4 *)&(rhs->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.field_0x1c;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpFileName =
       (rhs->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpFileName;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpLineNumber = IVar3;
  *(undefined4 *)&(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.field_0x1c = uVar4
  ;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_Allocator = pIVar1;
  (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Node_allocator.m_dvpDescription = pCVar2;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header,
             &(rhs->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header);
  pIVar1 = (rhs->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_Allocator;
  pCVar2 = (rhs->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpDescription;
  IVar3 = (rhs->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpLineNumber;
  uVar4 = *(undefined4 *)&(rhs->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.field_0x1c;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpFileName =
       (rhs->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpFileName;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpLineNumber = IVar3;
  *(undefined4 *)&(this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.field_0x1c = uVar4;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_Allocator = pIVar1;
  (this->m_FreeBlocksBySize)._M_t._M_impl.super__Node_allocator.m_dvpDescription = pCVar2;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header,
             &(rhs->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header);
  this->m_MaxSize = rhs->m_MaxSize;
  this->m_FreeSize = rhs->m_FreeSize;
  this->m_CurrAlignment = rhs->m_CurrAlignment;
  this->m_DbgDisableDebugValidation = rhs->m_DbgDisableDebugValidation;
  rhs->m_MaxSize = 0;
  rhs->m_FreeSize = 0;
  rhs->m_CurrAlignment = 0;
  return;
}

Assistant:

VariableSizeAllocationsManager(VariableSizeAllocationsManager&& rhs) noexcept
        : m_FreeBlocksByOffset{std::move(rhs.m_FreeBlocksByOffset)}
        , m_FreeBlocksBySize  {std::move(rhs.m_FreeBlocksBySize)  }
        , m_MaxSize           {rhs.m_MaxSize      }
        , m_FreeSize          {rhs.m_FreeSize     }
        , m_CurrAlignment     {rhs.m_CurrAlignment}
#ifdef DILIGENT_DEBUG
        , m_DbgDisableDebugValidation{rhs.m_DbgDisableDebugValidation}
#endif
    {
        // clang-format on
        rhs.m_MaxSize       = 0;
        rhs.m_FreeSize      = 0;
        rhs.m_CurrAlignment = 0;
    }